

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.h
# Opt level: O2

size_t mz_zip_read_archive_data(mz_zip_archive *pZip,mz_uint64 file_ofs,void *pBuf,size_t n)

{
  size_t sVar1;
  
  if (pZip != (mz_zip_archive *)0x0) {
    if (((pBuf != (void *)0x0) && (pZip->m_pState != (mz_zip_internal_state *)0x0)) &&
       (pZip->m_pRead != (mz_file_read_func)0x0)) {
      sVar1 = (*pZip->m_pRead)(pZip->m_pIO_opaque,file_ofs,pBuf,n);
      return sVar1;
    }
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
  }
  return 0;
}

Assistant:

size_t mz_zip_read_archive_data(mz_zip_archive *pZip, mz_uint64 file_ofs,
                                void *pBuf, size_t n) {
  if ((!pZip) || (!pZip->m_pState) || (!pBuf) || (!pZip->m_pRead))
    return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

  return pZip->m_pRead(pZip->m_pIO_opaque, file_ofs, pBuf, n);
}